

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

LUPMatrix * __thiscall
Matrix::GetLUPTransform(LUPMatrix *__return_storage_ptr__,Matrix *this,ChoiceType choice_type)

{
  bool bVar1;
  ostream *this_00;
  bool linear_independent;
  Matrix local_178;
  undefined1 local_158 [8];
  LinearSystem transformer;
  ChoiceType choice_type_local;
  Matrix *this_local;
  
  transformer.history_.
  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = choice_type;
  if (this->n_ == this->m_) {
    Identity(&local_178,this->n_);
    LinearSystem::LinearSystem((LinearSystem *)local_158,this,&local_178,LU);
    ~Matrix(&local_178);
    bVar1 = LinearSystem::RunDirectGauss
                      ((LinearSystem *)local_158,
                       transformer.history_.
                       super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    this_00 = operator<<((ostream *)Options::writer_abi_cxx11_,(LinearSystem *)local_158);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if (bVar1) {
      LinearSystem::GetLUPMatrix(__return_storage_ptr__,(LinearSystem *)local_158);
    }
    else {
      memset(__return_storage_ptr__,0,0x70);
      LUPMatrix::LUPMatrix(__return_storage_ptr__);
    }
    LinearSystem::~LinearSystem((LinearSystem *)local_158);
    return __return_storage_ptr__;
  }
  __assert_fail("n_ == m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                ,0x1bf,"LUPMatrix Matrix::GetLUPTransform(Options::ChoiceType) const");
}

Assistant:

LUPMatrix Matrix::GetLUPTransform(Options::ChoiceType choice_type) const {
  assert(n_ == m_);
  LinearSystem transformer(*this, Identity(n_), LinearSystem::Mode::LU);
  bool linear_independent = transformer.RunDirectGauss(choice_type);
  Options::writer << transformer << std::endl;
  if (!linear_independent) {
    return LUPMatrix();
  }

  return transformer.GetLUPMatrix();
}